

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

HivePartitioningIndex *
duckdb::HivePartitioningIndex::Deserialize
          (HivePartitioningIndex *__return_storage_ptr__,Deserializer *deserializer)

{
  unsigned_long index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  string local_30;
  
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(&value,deserializer,100,"value");
  index = Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,0x65,"index");
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value._M_dataplus._M_p == &value.field_2) {
    local_30.field_2._8_8_ = value.field_2._8_8_;
  }
  else {
    local_30._M_dataplus._M_p = value._M_dataplus._M_p;
  }
  local_30._M_string_length = value._M_string_length;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  value._M_dataplus._M_p = (pointer)&value.field_2;
  HivePartitioningIndex(__return_storage_ptr__,&local_30,index);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::~string((string *)&value);
  return __return_storage_ptr__;
}

Assistant:

HivePartitioningIndex HivePartitioningIndex::Deserialize(Deserializer &deserializer) {
	auto value = deserializer.ReadPropertyWithDefault<string>(100, "value");
	auto index = deserializer.ReadPropertyWithDefault<idx_t>(101, "index");
	HivePartitioningIndex result(std::move(value), index);
	return result;
}